

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O3

int write_unknown_chunks(spng_ctx *ctx,spng_location location)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  spng_unknown_chunk *type;
  
  if ((((ctx->stored).field_0x2 & 1) != 0) && (uVar2 = ctx->n_chunks, uVar2 != 0)) {
    type = ctx->chunk_list;
    uVar3 = 0;
    do {
      if (type->location == location) {
        iVar1 = write_chunk(ctx,type->type,type->data,type->length);
        if (iVar1 != 0) {
          return iVar1;
        }
        uVar2 = ctx->n_chunks;
      }
      uVar3 = uVar3 + 1;
      type = type + 1;
    } while (uVar3 < uVar2);
  }
  return 0;
}

Assistant:

static int write_unknown_chunks(spng_ctx *ctx, enum spng_location location)
{
    if(!ctx->stored.unknown) return 0;

    const struct spng_unknown_chunk *chunk = ctx->chunk_list;

    uint32_t i;
    for(i=0; i < ctx->n_chunks; i++, chunk++)
    {
        if(chunk->location != location) continue;

        int ret = write_chunk(ctx, chunk->type, chunk->data, chunk->length);
        if(ret) return ret;
    }

    return 0;
}